

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::sortMinDown
          (cbtAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,cbtDispatcher *param_3,
          bool updateOverlaps)

{
  int *piVar1;
  cbtOverlappingPairCallback *pcVar2;
  Edge EVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  Edge *pEVar8;
  uint uVar9;
  Handle *pHVar10;
  long lVar11;
  Handle *pHVar12;
  
  lVar11 = (long)axis;
  pEVar8 = this->m_pEdges[lVar11];
  uVar5 = (ulong)edge;
  uVar4 = pEVar8[uVar5 - 1].m_pos;
  if (pEVar8[uVar5].m_pos < uVar4) {
    pEVar8 = pEVar8 + uVar5;
    pHVar12 = this->m_pHandles + pEVar8->m_handle;
    uVar6 = 1 << (axis & 0x1fU) & 3;
    uVar9 = 1 << uVar6 & 3;
    do {
      pHVar10 = this->m_pHandles + pEVar8[-1].m_handle;
      lVar7 = 0x34;
      if ((uVar4 & 1) != 0) {
        lVar7 = 0x40;
      }
      if ((((((byte)uVar4 & 1 & updateOverlaps) == 1) &&
           (lVar7 = 0x40,
           *(uint *)((long)(&(pHVar10->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar6 * 4)
                    ) <= *(uint *)((long)pHVar12->m_maxEdges + (ulong)(uVar6 * 4)))) &&
          (*(uint *)((long)(&(pHVar12->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar6 * 4)
                    ) <= *(uint *)((long)pHVar10->m_maxEdges + (ulong)(uVar6 * 4)))) &&
         ((uVar5 = (ulong)(uVar9 * 4),
          *(uint *)((long)(&(pHVar10->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
          *(uint *)((long)pHVar12->m_maxEdges + uVar5) &&
          (uVar5 = (ulong)(uVar9 * 4),
          *(uint *)((long)(&(pHVar12->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar5) <=
          *(uint *)((long)pHVar10->m_maxEdges + uVar5))))) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar12,pHVar10);
        pcVar2 = this->m_userPairCallback;
        if (pcVar2 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar2->_vptr_cbtOverlappingPairCallback[2])(pcVar2,pHVar12,pHVar10);
        }
      }
      piVar1 = (int *)((long)(pHVar10->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                      lVar11 * 4 + lVar7 + -0x14);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)((long)(&(pHVar12->super_cbtBroadphaseProxy).m_aabbMax + 1) + lVar11 * 4);
      *piVar1 = *piVar1 + -1;
      EVar3 = *pEVar8;
      *pEVar8 = pEVar8[-1];
      pEVar8[-1] = EVar3;
      uVar4 = pEVar8[-2].m_pos;
      pEVar8 = pEVar8 + -1;
    } while (EVar3.m_pos < uVar4);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinDown(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (pPrev->IsMax())
		{
			// if previous edge is a maximum check the bounds and add an overlap if necessary
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandlePrev, axis1, axis2))
			{
				m_pairCache->addOverlappingPair(pHandleEdge, pHandlePrev);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(pHandleEdge, pHandlePrev);

				//AddOverlap(pEdge->m_handle, pPrev->m_handle);
			}

			// update edge reference in other handle
			pHandlePrev->m_maxEdges[axis]++;
		}
		else
			pHandlePrev->m_minEdges[axis]++;

		pHandleEdge->m_minEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
}